

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

bool QFileSystemEngine::setPermissions
               (QFileSystemEntry *entry,Permissions permissions,QSystemError *error)

{
  bool bVar1;
  mode_t __mode;
  int iVar2;
  qsizetype qVar3;
  uint *puVar4;
  long in_FS_OFFSET;
  NativePath local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QFileSystemEntry::isEmpty(entry);
  if (bVar1) {
    setPermissions();
  }
  else {
    QFileSystemEntry::nativeFilePath(&local_40,entry);
    qVar3 = QByteArray::indexOf(&local_40,'\0',0);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (qVar3 == -1) {
      __mode = QtPrivate::toMode_t(permissions);
      QFileSystemEntry::nativeFilePath(&local_40,entry);
      if (local_40.d.ptr == (char *)0x0) {
        local_40.d.ptr = "";
      }
      iVar2 = chmod(local_40.d.ptr,__mode);
      bVar1 = iVar2 == 0;
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (iVar2 == 0) goto LAB_003c5ddb;
      puVar4 = (uint *)__errno_location();
      *error = (QSystemError)((ulong)*puVar4 | 0x100000000);
    }
    else {
      setPermissions();
    }
  }
  bVar1 = false;
LAB_003c5ddb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::setPermissions(const QFileSystemEntry &entry,
                                       QFile::Permissions permissions, QSystemError &error)
{
    Q_CHECK_FILE_NAME(entry, false);

    mode_t mode = QtPrivate::toMode_t(permissions);
    bool success = ::chmod(entry.nativeFilePath().constData(), mode) == 0;
    if (!success)
        error = QSystemError(errno, QSystemError::StandardLibraryError);
    return success;
}